

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sarray2.c
# Opt level: O0

void * SparseArrayFind(SparseArray *sarray,uint32_t *index)

{
  uint32_t uVar1;
  SparseArray *sarray_00;
  void *pvVar2;
  void *ret;
  SparseArray *child;
  uint32_t zeromask;
  uint32_t max;
  uint32_t j;
  uint32_t *index_local;
  SparseArray *sarray_local;
  
  zeromask = *index >> ((byte)sarray->shift & 0x1f) & 0xff;
  if (sarray->shift == 0) {
    for (; zeromask < 0x100; zeromask = zeromask + 1) {
      if (sarray->data[zeromask] != (void *)0x0) {
        return sarray->data[zeromask];
      }
      *index = *index + 1;
    }
  }
  else {
    while (zeromask < 0xff) {
      uVar1 = sarray->shift;
      for (; zeromask < 0xff; zeromask = zeromask + 1) {
        sarray_00 = (SparseArray *)sarray->data[zeromask];
        if ((((sarray_00 == &EmptyArray) || (sarray_00 == &EmptyArray8)) ||
            (sarray_00 == &EmptyArray16)) || (sarray_00 == &EmptyArray24)) {
          *index = (1 << ((byte)sarray->shift & 0x1f)) + *index;
          *index = ((0xff << ((byte)uVar1 & 0x1f)) >> 8 ^ 0xffffffffU) & *index;
        }
        else {
          pvVar2 = SparseArrayFind(sarray_00,index);
          if (pvVar2 != (void *)0x0) {
            return pvVar2;
          }
        }
      }
    }
  }
  return (void *)0x0;
}

Assistant:

static void *SparseArrayFind(SparseArray * sarray, uint32_t * index)
{
	uint32_t j = MASK_INDEX((*index));
	uint32_t max = MAX_INDEX(sarray);
	if (sarray->shift == 0)
	{
		while (j<=max)
		{
			if (sarray->data[j] != SARRAY_EMPTY)
			{
				return sarray->data[j];
			}
			(*index)++;
			j++;
		}
	}
	else while (j<max)
	{
		// If the shift is not 0, then we need to recursively look at child
		// nodes.
		uint32_t zeromask = ~((0xff << sarray->shift) >> base_shift);
		while (j<max)
		{
			//Look in child nodes
			SparseArray *child = sarray->data[j];
			// Skip over known-empty children
			if ((&EmptyArray == child) ||
			    (&EmptyArray8 == child) ||
			    (&EmptyArray16 == child) ||
			    (&EmptyArray24 == child))
			{
				//Add 2^n to index so j is still correct
				(*index) += 1<<sarray->shift;
				//Zero off the next component of the index so we don't miss any.
				*index &= zeromask;
			}
			else
			{
				// The recursive call will set index to the correct value for
				// the next index, but won't update j
				void * ret = SparseArrayFind(child, index);
				if (ret != SARRAY_EMPTY)
				{
					return ret;
				}
			}
			//Go to the next child
			j++;
		}
	}
	return SARRAY_EMPTY;
}